

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O3

void __thiscall Socket::setLocalSocket(Socket *this,string *ipaddr,int port)

{
  int iVar1;
  runtime_error *this_00;
  undefined1 local_20 [4];
  undefined8 local_1c;
  char local_14 [4];
  
  local_14[0] = '\0';
  local_14[1] = '\0';
  local_14[2] = '\0';
  local_14[3] = '\0';
  local_1c._0_1_ = '\0';
  local_1c._1_1_ = '\0';
  local_1c._2_1_ = '\0';
  local_1c._3_1_ = '\0';
  local_1c._4_1_ = '\0';
  local_1c._5_1_ = '\0';
  local_1c._6_1_ = '\0';
  local_1c._7_1_ = '\0';
  local_20._0_2_ = 2;
  local_20._2_2_ = (ushort)port << 8 | (ushort)port >> 8;
  iVar1 = inet_aton((ipaddr->_M_dataplus)._M_p,(in_addr *)&local_1c);
  if (iVar1 == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"setLocalSocket() - invalid ip address");
  }
  else {
    iVar1 = bind(this->SocketFileDescriptor,(sockaddr *)local_20,0x10);
    if (iVar1 == 0) {
      return;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"setLocalSocket(): bind failed, is port already in use?");
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Socket::setLocalSocket(const std::string ipaddr, int port) {
  // zero out the structures
  struct sockaddr_in localSockAddr;
  std::memset((char *)&localSockAddr, 0, sizeof(localSockAddr));
  localSockAddr.sin_family = AF_INET;
  localSockAddr.sin_port = htons(port);

  int ret = inet_aton(ipaddr.c_str(), &localSockAddr.sin_addr);
  if (ret == 0) {
    throw std::runtime_error("setLocalSocket() - invalid ip address");
  }

  // bind socket to port
  ret = bind(SocketFileDescriptor, (struct sockaddr *)&localSockAddr, sizeof(localSockAddr));
  if (ret != 0) {
    throw std::runtime_error("setLocalSocket(): bind failed, is port already in use?");
  }
}